

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<char,_false,_false>::DirectSetItemAtRange
          (TypedArray<char,_false,_false> *this,int32 start,uint32 length,char typedValue)

{
  uint uVar1;
  uint uVar2;
  BOOL BVar3;
  uint32 uVar4;
  BOOL BVar5;
  
  BVar3 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<char,false,false>>(this);
  BVar5 = 0;
  if (BVar3 == 0) {
    if (((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == true)
    {
      JavascriptError::ThrowTypeError
                ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                     super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                 super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    BVar5 = 1;
    if (start < 0) {
      if ((long)((long)start + (ulong)length) < 0) {
        return 1;
      }
      length = length + start;
      start = 0;
    }
    if ((uint)start < (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length)
    {
      uVar4 = UInt32Math::Add(start,length);
      uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
      uVar2 = uVar1 - start;
      if (uVar4 <= uVar1) {
        uVar2 = length;
      }
      memset((this->super_TypedArrayBase).buffer + (uint)start,(uint)(byte)typedValue,(ulong)uVar2);
    }
  }
  return BVar5;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }